

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

tjhandle tjInitTransform(void)

{
  void *this;
  tjhandle pvVar1;
  long in_FS_OFFSET;
  
  this = calloc(1,0x6d8);
  if (this == (void *)0x0) {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb3),"ocation ",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xab),"failure",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"): Memor",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"y alloca",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjInitTr",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"ansform(",8);
  }
  else {
    *(undefined8 *)((long)this + 0x608) = 0x726f727265206f4e;
    *(undefined1 *)((long)this + 0x610) = 0;
    pvVar1 = _tjInitCompress(this);
    if (pvVar1 != (tjhandle)0x0) {
      pvVar1 = _tjInitDecompress(this);
      return pvVar1;
    }
  }
  return (tjhandle)0x0;
}

Assistant:

DLLEXPORT tjhandle tjInitTransform(void)
{
  tjinstance *this = NULL;
  tjhandle handle = NULL;

  if ((this = (tjinstance *)malloc(sizeof(tjinstance))) == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjInitTransform(): Memory allocation failure");
    return NULL;
  }
  MEMZERO(this, sizeof(tjinstance));
  snprintf(this->errStr, JMSG_LENGTH_MAX, "No error");
  handle = _tjInitCompress(this);
  if (!handle) return NULL;
  handle = _tjInitDecompress(this);
  return handle;
}